

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.h
# Opt level: O3

node<adj_ribs_in_data> *
add_prefix<adj_ribs_in_data>
          (node<adj_ribs_in_data> *root,uint32_t prefix,uint8_t prefix_len,adj_ribs_in_data data,
          bool *is_updated)

{
  bool bVar1;
  bool bVar2;
  node<adj_ribs_in_data> *pnVar3;
  adj_ribs_in_data *paVar4;
  undefined7 in_register_00000011;
  uint8_t n;
  byte n_00;
  uint uVar5;
  uint8_t n_01;
  uint uVar6;
  
  uVar6 = (int)CONCAT71(in_register_00000011,prefix_len) - 1;
  n_01 = (uint8_t)uVar6;
  if (n_01 != '\0') {
    n = '\0';
    pnVar3 = root;
    do {
      bVar1 = check_bit(prefix,n);
      pnVar3 = (&pnVar3->node_0)[bVar1];
      if (pnVar3 == (node<adj_ribs_in_data> *)0x0) break;
      if (pnVar3->is_prefix != false) {
        root = pnVar3;
      }
      n = n + '\x01';
    } while (n_01 != n);
  }
  n_00 = root->prefix_len;
  uVar5 = (uint)n_00;
  if ((int)(uint)n_00 < (int)uVar6) {
    do {
      bVar1 = check_bit(prefix,n_00);
      pnVar3 = (&root->node_0)[bVar1];
      if ((&root->node_0)[bVar1] == (node<adj_ribs_in_data> *)0x0) {
        pnVar3 = (node<adj_ribs_in_data> *)malloc(0x30);
        if (pnVar3 == (node<adj_ribs_in_data> *)0x0) goto LAB_00112d1a;
        pnVar3->is_prefix = false;
        pnVar3->prefix = root->prefix;
        pnVar3->prefix_len = n_00 + 1;
        pnVar3->parent = root;
        pnVar3->node_0 = (node<adj_ribs_in_data> *)0x0;
        pnVar3->node_1 = (node<adj_ribs_in_data> *)0x0;
        bVar1 = check_bit(prefix,n_00);
        if (bVar1) {
          pnVar3->prefix = pnVar3->prefix | 0x80000000U >> ((byte)uVar5 & 0x1f);
          root->node_1 = pnVar3;
        }
        else {
          root->node_0 = pnVar3;
        }
      }
      root = pnVar3;
      n_00 = n_00 + 1;
      uVar5 = (uint)n_00;
    } while (uVar5 < uVar6);
  }
  bVar1 = check_bit(prefix,n_01);
  pnVar3 = (&root->node_0)[bVar1];
  if (pnVar3 == (node<adj_ribs_in_data> *)0x0) {
    pnVar3 = (node<adj_ribs_in_data> *)malloc(0x30);
    if (pnVar3 != (node<adj_ribs_in_data> *)0x0) {
      pnVar3->is_prefix = true;
      uVar6 = root->prefix;
      pnVar3->prefix = uVar6;
      bVar2 = check_bit(prefix,n_01);
      if (bVar2) {
        pnVar3->prefix = uVar6 | 1 << ((byte)(0x20 - prefix_len) & 0x1f);
      }
      pnVar3->prefix_len = prefix_len;
      paVar4 = (adj_ribs_in_data *)malloc(0x118);
      pnVar3->data = paVar4;
      if (paVar4 != (adj_ribs_in_data *)0x0) {
        memcpy(paVar4,&data,0x118);
        pnVar3->parent = root;
        pnVar3->node_0 = (node<adj_ribs_in_data> *)0x0;
        pnVar3->node_1 = (node<adj_ribs_in_data> *)0x0;
        (&root->node_0)[bVar1] = pnVar3;
        if (is_updated == (bool *)0x0) {
          return pnVar3;
        }
        *is_updated = false;
        return pnVar3;
      }
    }
    goto LAB_00112d1a;
  }
  if (pnVar3->is_prefix == true) {
    bVar2 = true;
    if (is_updated != (bool *)0x0) {
LAB_00112cd1:
      *is_updated = bVar2;
    }
  }
  else {
    pnVar3->is_prefix = true;
    if (is_updated != (bool *)0x0) {
      bVar2 = false;
      goto LAB_00112cd1;
    }
  }
  paVar4 = pnVar3->data;
  if (paVar4 == (adj_ribs_in_data *)0x0) {
    paVar4 = (adj_ribs_in_data *)malloc(0x118);
    pnVar3->data = paVar4;
    paVar4 = (&root->node_0)[bVar1]->data;
    if (paVar4 == (adj_ribs_in_data *)0x0) {
LAB_00112d1a:
      puts("Failed to allocate memory");
      exit(1);
    }
  }
  memcpy(paVar4,&data,0x118);
  return (&root->node_0)[bVar1];
}

Assistant:

node<DATA_TYPE>* add_prefix(node<DATA_TYPE>* root, uint32_t prefix, uint8_t prefix_len, DATA_TYPE data, bool* is_updated = nullptr){
    node<DATA_TYPE>* current = search_prefix(root, prefix, prefix_len-1);
    uint8_t current_prefix_len = current->prefix_len;
#ifdef TEST_RIB_TREE_TEST_TREE
    printf("Get prefix: %d\n", current_prefix_len);
#endif
    node<DATA_TYPE>** growth_address_ptr;
    while(current_prefix_len < prefix_len - 1){ // 枝を伸ばす
        if(check_bit(prefix, current_prefix_len)){
            growth_address_ptr = &current->node_1;
        }else{
            growth_address_ptr = &current->node_0;
        }
        if((*growth_address_ptr) != nullptr){
            current = *growth_address_ptr;
        }else{
            auto* growth_node = (node<DATA_TYPE>*) malloc(sizeof(node<DATA_TYPE>));
            if(growth_node == nullptr){
                printf("Failed to allocate memory\n");
                exit(EXIT_FAILURE);
            }
            growth_node->is_prefix = false;
            growth_node->prefix = current->prefix;
            growth_node->prefix_len = current_prefix_len+1;
            growth_node->parent = current;
            growth_node->node_0 = nullptr;
            growth_node->node_1 = nullptr;
            if(check_bit(prefix, current_prefix_len)){
                growth_node->prefix |= (0b01 << (32 - (current_prefix_len + 1)));
                current->node_1 = growth_node;
            }else{
                current->node_0 = growth_node;
            }
#ifdef TEST_RIB_TREE_TEST_TREE
            printf("Create: %s/%d, %p\n", inet_ntoa(in_addr{.s_addr = htonl(growth_node->prefix)}), current_prefix_len+1, growth_node);
#endif
            current = growth_node;
        }
        current_prefix_len++;
    }

    if(check_bit(prefix, prefix_len - 1)){
        growth_address_ptr = &current->node_1;
    }else{
        growth_address_ptr = &current->node_0;
    }
    if((*growth_address_ptr) == nullptr){
        auto* new_prefix = (node<DATA_TYPE>*) malloc(sizeof(node<DATA_TYPE>));
        if(new_prefix == nullptr){
            printf("Failed to allocate memory\n");
            exit(EXIT_FAILURE);
        }
        new_prefix->is_prefix = true;
        new_prefix->prefix = current->prefix;
        if(check_bit(prefix, prefix_len-1)){
            new_prefix->prefix |= (0b01 << (32 - prefix_len));
        }
#ifdef TEST_RIB_TREE_TEST_TREE
        printf("Create Prefix: %s/%d, %p\n", inet_ntoa(in_addr{.s_addr = htonl(new_prefix->prefix)}), prefix_len, new_prefix);
#endif
        new_prefix->prefix_len = prefix_len;
        new_prefix->data = (DATA_TYPE*) malloc(sizeof(DATA_TYPE));
        if(new_prefix->data == nullptr){
            printf("Failed to allocate memory\n");
            exit(EXIT_FAILURE);
        }
        memcpy(new_prefix->data, &data, sizeof(DATA_TYPE));
        new_prefix->parent = current;
        new_prefix->node_0 = nullptr;
        new_prefix->node_1 = nullptr;
        *growth_address_ptr = new_prefix;
        if(is_updated != nullptr){
            *is_updated = false;
        }
    }else{
#ifdef TEST_RIB_TREE_TEST_TREE
        printf("Exist: %s/%d, %p\n", inet_ntoa(in_addr{.s_addr = htonl(prefix)}), prefix_len, (*growth_address_ptr));
#endif
        if((*growth_address_ptr)->is_prefix){
            if(is_updated != nullptr){
                *is_updated = true; // 書き込み先のノードがもともとプレフィックスだったら、それは経路の更新である
            }
        }else{
            (*growth_address_ptr)->is_prefix = true;
            if(is_updated != nullptr){
                *is_updated = false; // 書き込み先のノードがもともとプレフィックスでなかったら、それは経路の追加である
            }
        }
        if((*growth_address_ptr)->data == nullptr){
            (*growth_address_ptr)->data = (DATA_TYPE*) malloc(sizeof(DATA_TYPE));
            if((*growth_address_ptr)->data == nullptr){
                printf("Failed to allocate memory\n");
                exit(EXIT_FAILURE);
            }
        }
        memcpy((*growth_address_ptr)->data, &data, sizeof(DATA_TYPE));
    }

    return *growth_address_ptr;
}